

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsFreewheel.cpp
# Opt level: O1

void __thiscall
chrono::ChShaftsFreewheel::ChShaftsFreewheel(ChShaftsFreewheel *this,ChShaftsFreewheel *other)

{
  ChConstraintTwoGenericBoxed *pCVar1;
  undefined1 auVar2 [64];
  
  ChPhysicsItem::ChPhysicsItem((ChPhysicsItem *)this,(ChPhysicsItem *)other);
  (this->super_ChShaftsCouple).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChShaftsFreewheel_00b4d020;
  this->violation = 0.0;
  (this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.super_ChConstraint.c_i = 0.0
  ;
  (this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.super_ChConstraint.l_i = 0.0
  ;
  (this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.super_ChConstraint.b_i = 0.0
  ;
  (this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.super_ChConstraint.cfm_i =
       0.0;
  pCVar1 = &this->constraint;
  (pCVar1->super_ChConstraintTwoGeneric).super_ChConstraintTwo.super_ChConstraint.valid = false;
  (pCVar1->super_ChConstraintTwoGeneric).super_ChConstraintTwo.super_ChConstraint.disabled = false;
  (pCVar1->super_ChConstraintTwoGeneric).super_ChConstraintTwo.super_ChConstraint.redundant = false;
  (pCVar1->super_ChConstraintTwoGeneric).super_ChConstraintTwo.super_ChConstraint.broken = false;
  (this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.super_ChConstraint.active =
       true;
  (this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.super_ChConstraint.mode =
       CONSTRAINT_LOCK;
  (this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.super_ChConstraint.g_i = 0.0
  ;
  auVar2 = ZEXT464(0) << 0x40;
  *(undefined1 (*) [64])
   &(this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.variables_a = auVar2;
  (this->constraint).super_ChConstraintTwoGeneric.Cq_a = (ChRowVectorDynamic<double>)auVar2._0_16_;
  (this->constraint).super_ChConstraintTwoGeneric.Cq_b = (ChRowVectorDynamic<double>)auVar2._16_16_;
  (this->constraint).super_ChConstraintTwoGeneric.Eq_a = (ChVectorDynamic<double>)auVar2._32_16_;
  (this->constraint).super_ChConstraintTwoGeneric.Eq_b = (ChVectorDynamic<double>)auVar2._48_16_;
  (this->constraint).super_ChConstraintTwoGeneric.super_ChConstraintTwo.super_ChConstraint.
  _vptr_ChConstraint = (_func_int **)&PTR__ChConstraintTwoGeneric_00b62da0;
  (this->constraint).l_min = -1.0;
  (this->constraint).l_max = 1.0;
  this->step = other->step;
  this->torque_react = other->torque_react;
  this->jamming_mode = other->jamming_mode;
  this->phase = other->phase;
  this->alpha_max = other->alpha_max;
  this->free_forward = other->free_forward;
  return;
}

Assistant:

ChShaftsFreewheel::ChShaftsFreewheel(const ChShaftsFreewheel& other) : ChShaftsCouple(other), violation(0) {
    step = other.step;
    torque_react = other.torque_react;
    jamming_mode = other.jamming_mode;
    phase = other.phase;
    alpha_max = other.alpha_max;
    free_forward = other.free_forward;
}